

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O2

Vec_Int_t * Gia_ManComputeSwitchProbs(Gia_Man_t *pGia,int nFrames,int nPref,int fProbOne)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  Gia_ParSwi_t local_34;
  
  local_34.nWords = 10;
  local_34.nRandPiFactor = 0;
  local_34.fVerbose = 0;
  local_34.nIters = nFrames;
  pcVar1 = Abc_FrameReadFlag("seqsimframes");
  if (pcVar1 != (char *)0x0) {
    pcVar1 = Abc_FrameReadFlag("seqsimframes");
    local_34.nIters = atoi(pcVar1);
  }
  local_34.fProbOne = (int)(fProbOne != 0);
  local_34.fProbTrans = (int)(fProbOne == 0);
  local_34.nPref = nPref;
  pVVar2 = Gia_ManSwiSimulate(pGia,&local_34);
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_ManComputeSwitchProbs( Gia_Man_t * pGia, int nFrames, int nPref, int fProbOne )
{
    Gia_ParSwi_t Pars, * pPars = &Pars;
    // set the default parameters
    Gia_ManSetDefaultParamsSwi( pPars ); 
    // override some of the defaults
    pPars->nIters   = nFrames;  // set number of total timeframes
    if ( Abc_FrameReadFlag("seqsimframes") )
        pPars->nIters = atoi( Abc_FrameReadFlag("seqsimframes") );
    pPars->nPref    = nPref;    // set number of first timeframes to skip  
    // decide what should be computed
    if ( fProbOne )
    {
        // if the user asked to compute propability of 1, we do not need transition information
        pPars->fProbOne   = 1;  // enable computing probabiblity of being one
        pPars->fProbTrans = 0;  // disable computing transition probability 
    }
    else
    {
        // if the user asked for transition propabability, we do not need to compute probability of 1
        pPars->fProbOne   = 0;  // disable computing probabiblity of being one
        pPars->fProbTrans = 1;  // enable computing transition probability 
    }
    // perform the computation of switching activity
    return Gia_ManSwiSimulate( pGia, pPars );
}